

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameTypes.cpp
# Opt level: O1

void __thiscall wasm::NameTypes::run(NameTypes *this,Module *module)

{
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  char *pcVar1;
  bool bVar2;
  pointer pHVar3;
  char cVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  long *plVar7;
  size_type sVar8;
  undefined1 reuse;
  ulong uVar9;
  size_type *psVar10;
  undefined8 uVar11;
  undefined1 auVar12 [8];
  char cVar13;
  ulong __val;
  string_view sVar14;
  string_view s;
  string_view s_00;
  string_view s_01;
  undefined1 local_d8 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  used;
  undefined1 local_90 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  undefined1 local_70 [8];
  string __str;
  string name;
  
  types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)module;
  wasm::ModuleUtils::collectHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_90,module);
  pHVar3 = types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_d8 = (undefined1  [8])&used._M_h._M_rehash_policy._M_next_resize;
  used._M_h._M_buckets = (__buckets_ptr)0x1;
  used._M_h._M_bucket_count = 0;
  used._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  used._M_h._M_element_count._0_4_ = 0x3f800000;
  used._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  used._M_h._M_rehash_policy._4_4_ = 0;
  used._M_h._M_rehash_policy._M_next_resize = 0;
  if (local_90 !=
      (undefined1  [8])
      types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 0x32);
    __val = 0;
    auVar12 = local_90;
    do {
      cVar5 = std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(this_00,(key_type *)auVar12);
      if (cVar5.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
          _M_cur == (__node_type *)0x0) {
LAB_009a128c:
        cVar13 = '\x01';
        if (9 < __val) {
          uVar9 = __val;
          cVar4 = '\x04';
          do {
            cVar13 = cVar4;
            if (uVar9 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_009a12e6;
            }
            if (uVar9 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_009a12e6;
            }
            if (uVar9 < 10000) goto LAB_009a12e6;
            bVar2 = 99999 < uVar9;
            uVar9 = uVar9 / 10000;
            cVar4 = cVar13 + '\x04';
          } while (bVar2);
          cVar13 = cVar13 + '\x01';
        }
LAB_009a12e6:
        local_70 = (undefined1  [8])&__str._M_string_length;
        std::__cxx11::string::_M_construct((ulong)local_70,cVar13);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_70,(uint)__str._M_dataplus._M_p,__val);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0xe0f1b8);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar10) {
          name._M_string_length = *psVar10;
          name.field_2._M_allocated_capacity = plVar7[3];
          __str.field_2._8_8_ = &name._M_string_length;
        }
        else {
          name._M_string_length = *psVar10;
          __str.field_2._8_8_ = (size_type *)*plVar7;
        }
        name._M_dataplus._M_p = (pointer)plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        sVar14._M_str = (char *)0x0;
        sVar14._M_len = __str.field_2._8_8_;
        sVar14 = IString::interned((IString *)name._M_dataplus._M_p,sVar14,SUB81(psVar10,0));
        pmVar6 = std::__detail::
                 _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,(key_type *)auVar12);
        (pmVar6->name).super_IString.str = sVar14;
        if ((size_type *)__str.field_2._8_8_ != &name._M_string_length) {
          operator_delete((void *)__str.field_2._8_8_,name._M_string_length + 1);
        }
        if (local_70 != (undefined1  [8])&__str._M_string_length) {
          operator_delete((void *)local_70,__str._M_string_length + 1);
        }
        __val = __val + 1;
      }
      else {
        pmVar6 = std::__detail::
                 _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,(key_type *)auVar12);
        if (0x13 < (pmVar6->name).super_IString.str._M_len) goto LAB_009a128c;
      }
      pmVar6 = std::__detail::
               _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,(key_type *)auVar12);
      __str.field_2._8_8_ = local_d8;
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__str.field_2._8_8_,pmVar6,(undefined1 *)((long)&__str.field_2 + 8));
      auVar12 = (undefined1  [8])((long)auVar12 + 8);
    } while (auVar12 != (undefined1  [8])pHVar3);
  }
  if (local_90 !=
      (undefined1  [8])
      types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + 0x32;
    auVar12 = local_90;
    do {
      pmVar6 = std::__detail::
               _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)types.
                               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)auVar12
                           );
      pcVar1 = (pmVar6->name).super_IString.str._M_str;
      __str.field_2._8_8_ = &name._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&__str.field_2 + 8),pcVar1,
                 pcVar1 + (pmVar6->name).super_IString.str._M_len);
      while( true ) {
        if (name._M_dataplus._M_p < (pointer)0x2) break;
        if (9 < (int)name._M_dataplus._M_p[__str.field_2._8_8_ + -1] - 0x30U) {
          if ((name._M_dataplus._M_p >= (pointer)0x2) &&
             (name._M_dataplus._M_p[__str.field_2._8_8_ + -1] == '_')) {
            uVar11 = __str.field_2._8_8_;
            std::__cxx11::string::pop_back();
            s._M_str = (char *)0x0;
            s._M_len = __str.field_2._8_8_;
            reuse = (undefined1)uVar11;
            _local_70 = IString::interned((IString *)name._M_dataplus._M_p,s,(bool)reuse);
            sVar8 = std::
                    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_d8,(key_type *)local_70);
            if (sVar8 == 0) {
              s_00._M_str = (char *)0x0;
              s_00._M_len = __str.field_2._8_8_;
              sVar14 = IString::interned((IString *)name._M_dataplus._M_p,s_00,(bool)reuse);
              (pmVar6->name).super_IString.str = sVar14;
              s_01._M_str = (char *)0x0;
              s_01._M_len = __str.field_2._8_8_;
              _local_70 = IString::interned((IString *)name._M_dataplus._M_p,s_01,(bool)reuse);
              used._M_h._M_single_bucket = (__node_base_ptr)local_d8;
              std::
              _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<wasm::Name,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                        ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)used._M_h._M_single_bucket,local_70,&used._M_h._M_single_bucket);
            }
          }
          break;
        }
        std::__cxx11::string::pop_back();
      }
      if ((size_type *)__str.field_2._8_8_ != &name._M_string_length) {
        operator_delete((void *)__str.field_2._8_8_,name._M_string_length + 1);
      }
      auVar12 = (undefined1  [8])((long)auVar12 + 8);
    } while (auVar12 !=
             (undefined1  [8])
             types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_d8);
  if (local_90 != (undefined1  [8])0x0) {
    operator_delete((void *)local_90,
                    (long)types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_90);
  }
  return;
}

Assistant:

void run(Module* module) override {
    // Find all the types.
    std::vector<HeapType> types = ModuleUtils::collectHeapTypes(*module);

    std::unordered_set<Name> used;

    // Ensure simple names. If a name already exists, and is short enough, keep
    // it.
    size_t i = 0;
    for (auto& type : types) {
      if (module->typeNames.count(type) == 0 ||
          module->typeNames[type].name.size() >= NameLenLimit) {
        module->typeNames[type].name = "type_" + std::to_string(i++);
      }
      used.insert(module->typeNames[type].name);
    }

    // "Lint" the names a little. In particular a name with a "_7" or such
    // suffix, as TypeSSA creates, can be removed if it does not cause a
    // collision. This keeps the names unique while removing 'noise.'
    //
    // Note we must iterate in a deterministic order here, so do it on |types|.
    for (auto& type : types) {
      auto& names = module->typeNames[type];
      std::string name = names.name.toString();
      while (name.size() > 1 && isdigit(name.back())) {
        name.pop_back();
      }
      if (name.size() > 1 && name.back() == '_') {
        name.pop_back();
        if (!used.count(name)) {
          names.name = name;
          used.insert(name);
        }
      }
    }
  }